

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::DependencyVisitor::CombinationBlockVisitor::visit
          (CombinationBlockVisitor *this,AssignStmt *stmt)

{
  bool bVar1;
  Var **ppVVar2;
  type *this_00;
  type *this_01;
  reference __args;
  reference __in;
  type *__k;
  type *this_02;
  unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
  *this_03;
  const_iterator __first;
  const_iterator __last;
  type *entry;
  type *var_1;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
  local_f8;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  type *__range2_1;
  value_type *var;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  type *linked;
  type *dep;
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
  *local_20;
  AssignStmt *local_18;
  AssignStmt *stmt_local;
  CombinationBlockVisitor *this_local;
  
  local_18 = stmt;
  stmt_local = (AssignStmt *)this;
  ppVVar2 = AssignStmt::right(stmt);
  get_dep((DepSet *)&dep,*ppVVar2);
  local_20 = (pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
              *)&dep;
  this_00 = std::
            get<0ul,std::unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>,std::unordered_map<kratos::Var_const*,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>>>
                      (local_20);
  this_01 = std::
            get<1ul,std::unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>,std::unordered_map<kratos::Var_const*,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>>>>
                      (local_20);
  __end2 = std::
           unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
           ::begin(this_00);
  var = (value_type *)
        std::
        unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>
        ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<const_kratos::Var_*,_false>,
                       (_Node_iterator_base<const_kratos::Var_*,_false> *)&var);
    if (!bVar1) break;
    __args = std::__detail::_Node_const_iterator<const_kratos::Var_*,_true,_false>::operator*
                       (&__end2);
    std::
    unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
    ::emplace<kratos::Var_const*const&>
              ((unordered_set<kratos::Var_const*,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<kratos::Var_const*>>
                *)&this->vars_,__args);
    std::__detail::_Node_const_iterator<const_kratos::Var_*,_true,_false>::operator++(&__end2);
  }
  __end2_1 = std::
             unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
             ::begin(this_01);
  local_f8._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
       ::end(this_01);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false>
                       ,&local_f8);
    if (!bVar1) break;
    __in = std::__detail::
           _Node_const_iterator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false,_false>
           ::operator*(&__end2_1);
    __k = std::
          get<0ul,kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>
                    (__in);
    this_02 = std::
              get<1ul,kratos::Var_const*const,std::unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>>
                        (__in);
    this_03 = (unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
               *)std::
                 unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
                 ::operator[](&this->linked_vars_,__k);
    __first = std::
              unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
              ::begin(this_02);
    __last = std::
             unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
             ::end(this_02);
    std::
    unordered_map<unsigned_int,kratos::Var*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>>
    ::
    insert<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,kratos::Var*>,false,false>>
              (this_03,(_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>
                        )__first.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                         ._M_cur,
               (_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>)
               __last.super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
               ._M_cur);
    std::__detail::
    _Node_const_iterator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_false,_false>
    ::operator++(&__end2_1);
  }
  std::
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
  ::~pair((pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
           *)&dep);
  return;
}

Assistant:

void visit(AssignStmt *stmt) override {
            auto const &[dep, linked] = DependencyVisitor::get_dep(stmt->right());
            for (auto const &var : dep) vars_.emplace(var);
            for (auto const &[var, entry] : linked) {
                linked_vars_[var].insert(entry.begin(), entry.end());
            }
        }